

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::TryDecimalStringCast<int,(char)46>
               (char *string_ptr,idx_t string_size,int *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  idx_t iVar10;
  int iVar11;
  char *pcVar12;
  int iVar13;
  undefined7 in_register_00000081;
  uint uVar14;
  undefined7 in_register_00000089;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  ExponentData exponent;
  string_t value;
  bool local_d1;
  DecimalCastData<int> local_d0;
  CastParameters *local_c0;
  int *local_b8;
  ulong local_b0;
  ulong local_a8;
  string local_a0;
  uint local_80;
  undefined4 local_7c;
  undefined8 uStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar14 = (uint)CONCAT71(in_register_00000089,scale);
  uVar9 = CONCAT71(in_register_00000081,width) & 0xffffffff;
  bVar17 = false;
  local_d0.result = 0;
  local_d0.width = (uint8_t)uVar9;
  local_d0.digit_count = '\0';
  local_d0.decimal_count = '\0';
  local_d0.round_set = false;
  local_d0.should_round = false;
  local_d0.excessive_decimals = '\0';
  local_d0.exponent_type = NONE;
  local_d0.limit = *(StoreType_conflict *)(NumericHelper::POWERS_OF_TEN + uVar9 * 8);
  local_d0.scale = scale;
  if (string_size == 0) goto LAB_01296cc5;
  uVar9 = 0;
  do {
    bVar7 = string_ptr[uVar9];
    if ((4 < bVar7 - 9) && (bVar7 != 0x20)) {
      local_d0.digit_count = 0;
      local_c0 = parameters;
      local_b8 = result;
      if (bVar7 == 0x2d) {
        local_d0.result = 0;
        uVar3 = string_size - uVar9;
        uVar4 = 1;
        goto LAB_0129661a;
      }
      if (bVar7 == 0x30 && string_size - 1 != uVar9) {
        bVar1 = string_ptr[uVar9 + 1];
        if (bVar1 < 0x62) {
          if ((bVar1 == 0x42) || (bVar1 == 0x58)) {
LAB_01296844:
            if (0xfffffffffffffffd < (string_size - uVar9) - 3) {
              DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,false>(&local_d0);
              result = local_b8;
            }
            break;
          }
        }
        else if ((bVar1 == 0x62) || (bVar1 == 0x78)) goto LAB_01296844;
      }
      uVar3 = string_size - uVar9;
      uVar5 = (ulong)(bVar7 == 0x2b);
      local_d0.result = 0;
      uVar4 = uVar5;
      goto LAB_012968a7;
    }
    uVar9 = uVar9 + 1;
  } while (string_size != uVar9);
LAB_01296cc3:
  bVar17 = false;
  goto LAB_01296cc5;
LAB_0129661a:
  do {
    if (uVar3 <= uVar4) {
      local_d0._7_3_ = 0;
      goto LAB_0129670f;
    }
    bVar7 = string_ptr[uVar9 + uVar4] - 0x30;
    if (9 < bVar7) {
      local_d0._7_3_ = 0;
      if (string_ptr[uVar9 + uVar4] != '.') goto LAB_01296b0d;
      uVar5 = uVar4 + 1;
      iVar13 = 3;
      uVar6 = uVar5;
      if (uVar3 <= uVar5) goto LAB_01296adb;
      local_d0.decimal_count = 0;
      local_b0 = local_b0 & 0xffffffffffffff00;
      local_d1 = false;
      goto LAB_01296780;
    }
    uVar5 = uVar4 + 1;
    if ((bVar7 == 0) && (local_d0.result == 0)) {
LAB_01296646:
      bVar17 = true;
      if ((~uVar4 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar4] == '_')) {
        uVar5 = uVar4 + 2;
        if ((string_size - uVar4) - 2 == uVar9) {
          bVar17 = false;
        }
        else {
          bVar17 = (byte)(string_ptr[uVar9 + uVar5] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_d0.digit_count) &&
         (local_d0.digit_count = local_d0.digit_count + 1, -0xccccccd < local_d0.result)) {
        local_d0.result = local_d0.result * 10 - (uint)bVar7;
        goto LAB_01296646;
      }
      bVar17 = false;
    }
    uVar4 = uVar5;
  } while (bVar17);
  goto LAB_0129694b;
  while (uVar6 = uVar15, uVar15 < uVar3) {
LAB_01296780:
    bVar7 = string_ptr[uVar9 + uVar6] - 0x30;
    local_a8 = uVar5;
    if (9 < bVar7) {
      iVar13 = 0;
      goto LAB_01296ab9;
    }
    if ((local_d0.decimal_count == scale) && ((char)local_b0 == '\0')) {
      local_d1 = 4 < bVar7;
      local_b0 = CONCAT71(local_b0._1_7_,1);
    }
    bVar17 = (uint)local_d0.decimal_count + (uint)local_d0.digit_count < 9;
    iVar13 = local_d0.result * 10 - (uint)bVar7;
    if (!bVar17) {
      iVar13 = local_d0.result;
    }
    local_d0.result = iVar13;
    local_d0.decimal_count = local_d0.decimal_count + bVar17;
    uVar15 = uVar6 + 1;
    if (((~uVar6 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar6] == '_')) &&
       ((uVar15 = uVar6 + 2, (string_size - uVar6) - 2 == uVar9 ||
        (9 < (byte)(string_ptr[uVar9 + uVar15] - 0x30U))))) {
      local_d0.round_set = (bool)(char)local_b0;
      local_d0.should_round = local_d1;
      uVar6 = uVar15;
      iVar11 = 1;
      goto LAB_01296af2;
    }
  }
  iVar13 = 3;
LAB_01296ab9:
  local_d0.round_set = (bool)(char)local_b0;
  local_d0.should_round = local_d1;
LAB_01296adb:
  iVar11 = 1;
  if (uVar5 < uVar6) {
    iVar11 = iVar13;
  }
  if (1 < uVar4) {
    iVar11 = iVar13;
  }
LAB_01296af2:
  uVar4 = uVar6;
  if (iVar11 != 3) {
    if (iVar11 != 0) goto LAB_01296cc3;
LAB_01296b0d:
    bVar7 = string_ptr[uVar9 + uVar4];
    bVar17 = false;
    uVar8 = (uint)bVar7;
    if (bVar7 < 0x20) {
      if (4 < uVar8 - 9) goto LAB_01296cc5;
    }
    else {
      if ((bVar7 == 0x65) || (uVar8 == 0x45)) {
        if ((uVar4 != 1) && (uVar4 + 1 < uVar3)) {
          local_a0._M_dataplus._M_p._0_2_ = 0;
          pcVar12 = string_ptr + uVar9 + uVar4 + 1;
          iVar10 = ~uVar9 + (string_size - uVar4);
          if (*pcVar12 == '-') {
            bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar10,(IntegerCastData<short> *)&local_a0,false);
          }
          else {
            bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar10,(IntegerCastData<short> *)&local_a0,false);
          }
          bVar17 = false;
          parameters = local_c0;
          result = local_b8;
          if (bVar2 != false) {
            bVar17 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<int>,true>
                               (&local_d0,(int)(short)local_a0._M_dataplus._M_p);
            parameters = local_c0;
            result = local_b8;
          }
          goto LAB_01296cc5;
        }
        goto LAB_01296cc3;
      }
      if (uVar8 != 0x20) goto LAB_01296cc5;
    }
    uVar5 = uVar4 + 1;
    uVar4 = uVar5;
    if (uVar5 < uVar3) {
      do {
        if ((4 < (byte)string_ptr[uVar9 + uVar5] - 9) && (string_ptr[uVar9 + uVar5] != 0x20))
        goto LAB_01296cc3;
        uVar5 = uVar5 + 1;
        uVar4 = uVar3;
      } while (uVar3 != uVar5);
    }
  }
LAB_0129670f:
  bVar17 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,true>(&local_d0);
  if (bVar17) {
    bVar17 = 1 < uVar4;
    parameters = local_c0;
    result = local_b8;
    goto LAB_01296cc5;
  }
  goto LAB_0129697d;
LAB_012968a7:
  do {
    if (uVar3 <= uVar4) {
      local_d0._7_3_ = 0;
      goto LAB_01296965;
    }
    bVar7 = string_ptr[uVar9 + uVar4] - 0x30;
    if (9 < bVar7) {
      local_d0._7_3_ = 0;
      if (string_ptr[uVar9 + uVar4] != '.') goto LAB_01296c1d;
      uVar6 = uVar4 + 1;
      iVar13 = 3;
      uVar15 = uVar6;
      if (uVar3 <= uVar6) goto LAB_01296be9;
      local_d0.decimal_count = 0;
      local_d0.round_set = false;
      local_d1 = false;
      goto LAB_012969e2;
    }
    uVar6 = uVar4 + 1;
    if ((bVar7 == 0) && (local_d0.result == 0)) {
LAB_012968d3:
      bVar17 = true;
      if ((~uVar4 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar4] == '_')) {
        uVar6 = uVar4 + 2;
        if ((string_size - uVar4) - 2 == uVar9) {
          bVar17 = false;
        }
        else {
          bVar17 = (byte)(string_ptr[uVar9 + uVar6] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_d0.digit_count) &&
         (local_d0.digit_count = local_d0.digit_count + 1, local_d0.result < 0xccccccd)) {
        local_d0.result = (uint)bVar7 + local_d0.result * 10;
        goto LAB_012968d3;
      }
      bVar17 = false;
    }
    uVar4 = uVar6;
  } while (bVar17);
LAB_0129694b:
  local_d0._7_3_ = 0;
  goto LAB_0129697d;
  while (uVar15 = uVar16, uVar16 < uVar3) {
LAB_012969e2:
    bVar7 = string_ptr[uVar9 + uVar15] - 0x30;
    local_a8 = uVar6;
    if (9 < bVar7) {
      iVar13 = 0;
      goto LAB_01296bc6;
    }
    if ((local_d0.decimal_count == scale) && (local_d0.round_set == false)) {
      local_d1 = 4 < bVar7;
      local_d0.round_set = true;
    }
    bVar17 = (uint)local_d0.decimal_count + (uint)local_d0.digit_count < 9;
    iVar13 = (uint)bVar7 + local_d0.result * 10;
    if (!bVar17) {
      iVar13 = local_d0.result;
    }
    local_d0.result = iVar13;
    local_d0.decimal_count = local_d0.decimal_count + bVar17;
    uVar16 = uVar15 + 1;
    if (((~uVar15 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar15] == '_')) &&
       ((uVar16 = uVar15 + 2, (string_size - uVar15) - 2 == uVar9 ||
        (9 < (byte)(string_ptr[uVar9 + uVar16] - 0x30U))))) {
      local_d0.should_round = local_d1;
      uVar15 = uVar16;
      iVar11 = 1;
      goto LAB_01296bff;
    }
  }
  iVar13 = 3;
LAB_01296bc6:
  local_d0.should_round = local_d1;
LAB_01296be9:
  iVar11 = 1;
  if (uVar6 < uVar15) {
    iVar11 = iVar13;
  }
  if (uVar5 < uVar4) {
    iVar11 = iVar13;
  }
LAB_01296bff:
  uVar4 = uVar15;
  if (iVar11 != 3) {
    local_b0 = uVar5;
    if (iVar11 != 0) goto LAB_01296cc3;
LAB_01296c1d:
    bVar7 = string_ptr[uVar9 + uVar4];
    bVar17 = false;
    uVar8 = (uint)bVar7;
    if (bVar7 < 0x20) {
      local_b0 = uVar5;
      if (4 < uVar8 - 9) goto LAB_01296cc5;
    }
    else {
      if ((bVar7 == 0x65) || (uVar8 == 0x45)) {
        local_b0 = uVar5;
        if ((uVar4 != uVar5) && (uVar4 + 1 < uVar3)) {
          local_a0._M_dataplus._M_p._0_2_ = 0;
          pcVar12 = string_ptr + uVar9 + uVar4 + 1;
          iVar10 = ~uVar9 + (string_size - uVar4);
          if (*pcVar12 == '-') {
            bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar10,(IntegerCastData<short> *)&local_a0,false);
          }
          else {
            bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar10,(IntegerCastData<short> *)&local_a0,false);
          }
          bVar17 = false;
          parameters = local_c0;
          result = local_b8;
          if (bVar2 != false) {
            bVar17 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<int>,false>
                               (&local_d0,(int)(short)local_a0._M_dataplus._M_p);
            parameters = local_c0;
            result = local_b8;
          }
          goto LAB_01296cc5;
        }
        goto LAB_01296cc3;
      }
      local_b0 = uVar5;
      if (uVar8 != 0x20) goto LAB_01296cc5;
    }
    uVar6 = uVar4 + 1;
    uVar4 = uVar6;
    if (uVar6 < uVar3) {
      do {
        if ((4 < (byte)string_ptr[uVar9 + uVar6] - 9) &&
           (local_b0 = uVar5, string_ptr[uVar9 + uVar6] != 0x20)) goto LAB_01296cc3;
        uVar6 = uVar6 + 1;
        uVar4 = uVar3;
      } while (uVar3 != uVar6);
    }
  }
LAB_01296965:
  local_b0 = uVar5;
  bVar17 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,false>(&local_d0);
  if (bVar17) {
    bVar17 = local_b0 < uVar4;
    parameters = local_c0;
    result = local_b8;
    goto LAB_01296cc5;
  }
LAB_0129697d:
  bVar17 = false;
  parameters = local_c0;
  result = local_b8;
LAB_01296cc5:
  if (bVar17 == false) {
    local_80 = (uint)string_size;
    uVar8 = uVar14;
    local_c0 = parameters;
    if (local_80 < 0xd) {
      uStack_78._4_4_ = 0;
      local_7c = 0;
      uStack_78._0_4_ = 0;
      uStack_78 = (char *)0x0;
      if (local_80 != 0) {
        switchD_012dd528::default(&local_7c,string_ptr,(ulong)(local_80 & 0xf));
        uStack_78 = (char *)CONCAT44(uStack_78._4_4_,(undefined4)uStack_78);
      }
    }
    else {
      local_7c = *(undefined4 *)string_ptr;
      uStack_78 = string_ptr;
    }
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Could not convert string \"%s\" to DECIMAL(%d,%d)","");
    pcVar12 = (char *)&local_7c;
    if (0xc < (ulong)local_80) {
      pcVar12 = uStack_78;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar12,pcVar12 + local_80);
    StringUtil::Format<std::__cxx11::string,int,int>
              (&local_a0,(StringUtil *)local_50,&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)width,
               uVar14 & 0xff,uVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    HandleCastError::AssignError(&local_a0,local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(local_a0._M_dataplus._M_p._2_6_,(short)local_a0._M_dataplus._M_p) !=
        &local_a0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT62(local_a0._M_dataplus._M_p._2_6_,(short)local_a0._M_dataplus._M_p));
    }
  }
  else {
    *result = local_d0.result;
  }
  return bVar17;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}